

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_boundary_anchor(char prev,char next)

{
  char *pcVar1;
  char in_SIL;
  char in_DIL;
  char *word;
  int local_4;
  
  pcVar1 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",(int)in_SIL);
  if ((pcVar1 == (char *)0x0) || (in_DIL != '\0')) {
    pcVar1 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",(int)in_DIL);
    if ((pcVar1 == (char *)0x0) || (in_SIL != '\0')) {
      pcVar1 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",(int)in_SIL)
      ;
      if ((pcVar1 != (char *)0x0) &&
         (pcVar1 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",
                          (int)in_DIL), pcVar1 == (char *)0x0)) {
        return 1;
      }
      pcVar1 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",(int)in_SIL)
      ;
      if ((pcVar1 == (char *)0x0) &&
         (pcVar1 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_",
                          (int)in_DIL), pcVar1 != (char *)0x0)) {
        return 1;
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int mpc_boundary_anchor(char prev, char next) {
  const char* word = "abcdefghijklmnopqrstuvwxyz"
                     "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                     "0123456789_";
  if ( strchr(word, next) &&  prev == '\0') { return 1; }
  if ( strchr(word, prev) &&  next == '\0') { return 1; }
  if ( strchr(word, next) && !strchr(word, prev)) { return 1; }
  if (!strchr(word, next) &&  strchr(word, prev)) { return 1; }
  return 0;
}